

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ct_sct.c
# Opt level: O0

int SCT_set1_log_id(SCT *sct,uchar *log_id,size_t log_id_len)

{
  void *pvVar1;
  char *in_RDX;
  char *in_RSI;
  int *in_RDI;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar2;
  
  if ((*in_RDI == 0) && (in_RDX != (char *)0x20)) {
    ERR_new();
    ERR_set_debug((char *)in_RDI,(int)((ulong)in_RSI >> 0x20),in_RDX);
    ERR_set_error(0x32,100,(char *)0x0);
    iVar2 = 0;
  }
  else {
    CRYPTO_free(*(void **)(in_RDI + 6));
    in_RDI[6] = 0;
    in_RDI[7] = 0;
    in_RDI[8] = 0;
    in_RDI[9] = 0;
    in_RDI[0x18] = 0;
    if ((in_RSI != (char *)0x0) && (in_RDX != (char *)0x0)) {
      pvVar1 = CRYPTO_memdup((void *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                             (size_t)in_RDI,in_RSI,(int)((ulong)in_RDX >> 0x20));
      iVar2 = (int)((ulong)in_RSI >> 0x20);
      *(void **)(in_RDI + 6) = pvVar1;
      if (*(long *)(in_RDI + 6) == 0) {
        ERR_new();
        ERR_set_debug((char *)in_RDI,iVar2,in_RDX);
        ERR_set_error(0x32,0xc0100,(char *)0x0);
        return 0;
      }
      *(char **)(in_RDI + 8) = in_RDX;
    }
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int SCT_set1_log_id(SCT *sct, const unsigned char *log_id, size_t log_id_len)
{
    if (sct->version == SCT_VERSION_V1 && log_id_len != CT_V1_HASHLEN) {
        ERR_raise(ERR_LIB_CT, CT_R_INVALID_LOG_ID_LENGTH);
        return 0;
    }

    OPENSSL_free(sct->log_id);
    sct->log_id = NULL;
    sct->log_id_len = 0;
    sct->validation_status = SCT_VALIDATION_STATUS_NOT_SET;

    if (log_id != NULL && log_id_len > 0) {
        sct->log_id = OPENSSL_memdup(log_id, log_id_len);
        if (sct->log_id == NULL) {
            ERR_raise(ERR_LIB_CT, ERR_R_MALLOC_FAILURE);
            return 0;
        }
        sct->log_id_len = log_id_len;
    }
    return 1;
}